

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SpecialFormat.cpp
# Opt level: O0

bool IsLogoProfTrack(Track *track)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  reference this;
  Sector *pSVar4;
  int min_offset;
  Sector *s;
  const_iterator __end1;
  const_iterator __begin1;
  Track *__range1;
  int id;
  Track *track_local;
  
  iVar2 = Track::size(track);
  if ((iVar2 == 10) || (iVar2 = Track::size(track), iVar2 == 0xb)) {
    __range1._4_4_ = 2;
    __end1 = Track::begin(track);
    s = (Sector *)Track::end(track);
    while (bVar1 = __gnu_cxx::operator!=
                             (&__end1,(__normal_iterator<const_Sector_*,_std::vector<Sector,_std::allocator<Sector>_>_>
                                       *)&s), bVar1) {
      this = __gnu_cxx::
             __normal_iterator<const_Sector_*,_std::vector<Sector,_std::allocator<Sector>_>_>::
             operator*(&__end1);
      iVar2 = Track::size(track);
      if ((iVar2 == 0xb) && ((this->header).sector == 1)) {
        bVar1 = Sector::has_badidcrc(this);
        if (!bVar1) {
          return false;
        }
      }
      else if (((this->datarate != _250K) ||
               (((this->encoding != MFM || ((this->header).sector != __range1._4_4_)) ||
                (iVar2 = Sector::size(this), iVar2 != 0x200)))) ||
              (bVar1 = Sector::has_good_data(this), __range1._4_4_ = __range1._4_4_ + 1, !bVar1)) {
        return false;
      }
      __gnu_cxx::__normal_iterator<const_Sector_*,_std::vector<Sector,_std::allocator<Sector>_>_>::
      operator++(&__end1);
    }
    iVar2 = Track::size(track);
    if (iVar2 == 10) {
      iVar2 = Sector::SizeCodeToLength(1);
      iVar3 = GetSectorOverhead(MFM);
      pSVar4 = Track::operator[](track,0);
      if (pSVar4->offset < (iVar2 + iVar3) * 0x10) {
        return false;
      }
    }
    if (opt.debug != 0) {
      util::operator<<((LogHelper *)&util::cout,(char (*) [31])"detected Logo Professor track\n");
    }
    track_local._7_1_ = true;
  }
  else {
    track_local._7_1_ = false;
  }
  return track_local._7_1_;
}

Assistant:

bool IsLogoProfTrack(const Track& track)
{
    // Accept track with or without placeholder sector
    if (track.size() != 10 && track.size() != 11)
        return false;

    // First non-placeholder sector id.
    int id = 2;

    for (auto& s : track)
    {
        // Check for placeholder sector, present in old EDSK images.
        if (track.size() == 11 && s.header.sector == 1)
        {
            // It must have a bad ID header CRC.
            if (s.has_badidcrc())
                continue;
            else
                return false;
        }

        // Ensure each sector is double-density MFM, 512-bytes, with good data
        if (s.datarate != DataRate::_250K || s.encoding != Encoding::MFM ||
            s.header.sector != id++ || s.size() != 512 || !s.has_good_data())
            return false;
    }

    // If there's no placeholder, the first sector must begin late
    if (track.size() == 10)
    {
        // Determine an offset considered late
        auto min_offset = Sector::SizeCodeToLength(1) + GetSectorOverhead(Encoding::MFM);

        // Reject if first sector doesn't start late on the track
        if (track[0].offset < (min_offset * 16))
            return false;
    }

    if (opt.debug) util::cout << "detected Logo Professor track\n";
    return true;
}